

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

ostream * tcb::operator<<(ostream *os,rational<char> *r)

{
  value_type_conflict1 vVar1;
  ostream *poVar2;
  rational<char> *r_local;
  ostream *os_local;
  
  vVar1 = rational<char>::num(r);
  std::operator<<(os,vVar1);
  vVar1 = rational<char>::denom(r);
  if (vVar1 != '\x01') {
    poVar2 = std::operator<<(os,'/');
    vVar1 = rational<char>::denom(r);
    std::operator<<(poVar2,vVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}